

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  f64 fVar4;
  f64 fVar5;
  Buffer boot_rom_file;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_19d30;
  GB gb;
  
  ParseArguments(argc,argv);
  boot_rom_file.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boot_rom_file.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  boot_rom_file.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (s_boot_rom_filename != (char *)0x0) {
    ReadFile(&gb.rom,s_boot_rom_filename);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&boot_rom_file,&gb);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gb);
    ThrowUnless((long)boot_rom_file.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)boot_rom_file.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x100,"Invalid boot rom size");
  }
  ReadFile((Buffer *)&_Stack_19d30,s_filename);
  GB::GB(&gb,(Buffer *)&_Stack_19d30,&boot_rom_file,Guess);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_19d30);
  uVar1 = (ulong)(uint)(s_frames * 0x11250);
  fVar4 = GetTime();
  if (s_trace == '\0') {
    uVar2 = uVar1;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      GB::Step(&gb);
    }
  }
  else {
    uVar2 = uVar1;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      GB::Trace(&gb);
      GB::Step(&gb);
    }
  }
  fVar5 = GetTime();
  printf("time: gb=%.1fs host=%.1fs (%.1fx)\n",(double)uVar1 * 2.384185791015625e-07,
         (double)fVar5 - (double)fVar4,
         ((double)uVar1 * 2.384185791015625e-07) / ((double)fVar5 - (double)fVar4));
  if (s_ppm_filename != (char *)0x0) {
    WriteFramePPM(&gb,s_ppm_filename);
  }
  GB::~GB(&gb);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&boot_rom_file.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  try {
    ParseArguments(argc, argv);

    Buffer boot_rom_file;
    if (s_boot_rom_filename) {
      boot_rom_file = ReadFile(s_boot_rom_filename);
      ThrowUnless(boot_rom_file.size() == 256, "Invalid boot rom size");
    }

    GB gb(ReadFile(s_filename), std::move(boot_rom_file), Variant::Guess);

    Clock run_clocks = s_frames * 70224u;
    f64 start_time = GetTime();
    if (s_trace) {
      for (Clock i = 0; i < run_clocks; ++i) {
        gb.Trace();
        gb.Step();
      }
    } else {
      for (Clock i = 0; i < run_clocks; ++i) {
        gb.Step();
#if 0
        if (gb.s.pc == 0x100 && gb.s.op_tick == 2) {
          printf("io: {\n  ");
          for (int i = 0; i < 0x4c; ++i) {
            printf("0x%02x,", gb.s.io[i]);
            if (((i+1) & 7) == 0) {
              printf("\n  ");
            }
          }
          printf("\n}\n");
          printf("af=0x%02x\n", gb.s.af);
          printf("bc=0x%02x\n", gb.s.bc);
          printf("de=0x%02x\n", gb.s.de);
          printf("hl=0x%02x\n", gb.s.hl);
          printf("sp=0x%02x\n", gb.s.sp);
          printf("pc=0x%02x\n", gb.s.pc);
          printf("ppu_mode = %d\n", gb.s.ppu_mode);
          printf("ppu_line_y = %d\n", gb.s.ppu_line_y);
          printf("tick = %lu\n", gb.s.tick);
          printf("ppu_lcd_on_tick = %ld\n", gb.s.ppu_lcd_on_tick);
          printf("ppu_line_start_tick = %ld\n", gb.s.ppu_line_start_tick);
          printf("ppu_mode_start_tick = %ld\n", gb.s.ppu_mode_start_tick);
          printf("div_reset_tick = %ld\n", gb.s.div_reset_tick);
        }
#endif
      }
    }
    f64 host_time = GetTime() - start_time;
    f64 gb_time = (f64)run_clocks / CpuClocksPerSec;
    printf("time: gb=%.1fs host=%.1fs (%.1fx)\n", gb_time, host_time,
           gb_time / host_time);

    if (s_ppm_filename) {
      WriteFramePPM(gb, s_ppm_filename);
    }

    return 0;
  } catch (const Error& e) {
    std::cerr << e.what() << "\n";
    return 1;
  }
}